

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void google::protobuf::internal::PackedFieldHelper<16>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  long *plVar1;
  long *plVar2;
  int i;
  int index;
  RepeatedField<long> *array;
  
  if (*field != 0) {
    WriteTagTo<google::protobuf::internal::ArrayOutput>(md->tag,output);
    WriteLengthTo<google::protobuf::internal::ArrayOutput>(*(uint32_t *)((long)field + 0x10),output)
    ;
    for (index = 0; index < *field; index = index + 1) {
      plVar2 = RepeatedField<long>::Get((RepeatedField<long> *)field,index);
      plVar1 = (long *)output->ptr;
      *plVar1 = *plVar2;
      output->ptr = (uint8_t *)(plVar1 + 1);
    }
  }
  return;
}

Assistant:

inline bool RepeatedField<Element>::empty() const {
  return current_size_ == 0;
}